

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O2

size_t destroy_mspace(mspace msp)

{
  undefined8 *puVar1;
  int iVar2;
  size_t sVar3;
  undefined8 *puVar4;
  size_t __len;
  
  sVar3 = 0;
  puVar1 = (undefined8 *)((long)msp + 0x378);
  while (puVar4 = puVar1, puVar4 != (undefined8 *)0x0) {
    puVar1 = (undefined8 *)puVar4[2];
    if ((*(uint *)(puVar4 + 3) & 9) == 1) {
      __len = puVar4[1];
      iVar2 = munmap((void *)*puVar4,__len);
      if (iVar2 != 0) {
        __len = 0;
      }
      sVar3 = sVar3 + __len;
    }
  }
  return sVar3;
}

Assistant:

size_t destroy_mspace(mspace msp) {
  size_t freed = 0;
  mstate ms = (mstate)msp;
  if (ok_magic(ms)) {
    msegmentptr sp = &ms->seg;
    (void)DESTROY_LOCK(&ms->mutex); /* destroy before unmapped */
    while (sp != 0) {
      char* base = sp->base;
      size_t size = sp->size;
      flag_t flag = sp->sflags;
      (void)base; /* placate people compiling -Wunused-variable */
      sp = sp->next;
      if ((flag & USE_MMAP_BIT) && !(flag & EXTERN_BIT) &&
          CALL_MUNMAP(base, size) == 0)
        freed += size;
    }
  }
  else {
    USAGE_ERROR_ACTION(ms,ms);
  }
  return freed;
}